

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_curve.cxx
# Opt level: O1

void __thiscall
Fl_Graphics_Driver::curve
          (Fl_Graphics_Driver *this,double X0,double Y0,double X1,double Y1,double X2,double Y2,
          double X3,double Y3)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar3 = transform_x(fl_graphics_driver,X0,Y0);
  dVar4 = transform_y(fl_graphics_driver,X0,Y0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(dVar3,dVar4);
  dVar5 = transform_x(fl_graphics_driver,X1,Y1);
  dVar6 = transform_y(fl_graphics_driver,X1,Y1);
  dVar7 = transform_x(fl_graphics_driver,X2,Y2);
  dVar8 = transform_y(fl_graphics_driver,X2,Y2);
  dVar9 = transform_x(fl_graphics_driver,X3,Y3);
  dVar10 = transform_y(fl_graphics_driver,X3,Y3);
  dVar12 = ABS((dVar10 - dVar6) * (dVar3 - dVar7) - (dVar9 - dVar5) * (dVar4 - dVar8));
  dVar11 = ABS((dVar8 - dVar6) * (dVar3 - dVar9) - (dVar7 - dVar5) * (dVar4 - dVar10));
  if (dVar11 <= dVar12) {
    dVar11 = dVar12;
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  iVar2 = (int)(dVar11 * 0.25);
  if (1 < iVar2) {
    iVar1 = 100;
    if (iVar2 < 100) {
      iVar1 = iVar2;
    }
    dVar12 = 1.0 / (double)iVar1;
    dVar13 = (dVar5 * 3.0 + dVar7 * -3.0 + dVar9) - dVar3;
    dVar7 = ((dVar7 - (dVar5 + dVar5)) + dVar3) * 3.0;
    dVar5 = ((dVar13 * dVar12 + dVar7) * dVar12 + (dVar5 - dVar3) * 3.0) * dVar12;
    dVar14 = (dVar6 * 3.0 + dVar8 * -3.0 + dVar10) - dVar4;
    dVar11 = ((dVar8 - (dVar6 + dVar6)) + dVar4) * 3.0;
    dVar6 = ((dVar14 * dVar12 + dVar11) * dVar12 + (dVar6 - dVar4) * 3.0) * dVar12;
    if (iVar2 != 2) {
      dVar11 = (dVar11 + dVar11) * dVar12 * dVar12;
      dVar7 = (dVar7 + dVar7) * dVar12 * dVar12;
      iVar2 = 3;
      if (3 < iVar1) {
        iVar2 = iVar1;
      }
      iVar2 = iVar2 + -2;
      do {
        dVar7 = dVar7 + dVar13 * 6.0 * dVar12 * dVar12 * dVar12;
        dVar11 = dVar11 + dVar14 * 6.0 * dVar12 * dVar12 * dVar12;
        dVar3 = dVar3 + dVar5;
        dVar5 = dVar5 + dVar7;
        dVar4 = dVar4 + dVar6;
        dVar6 = dVar6 + dVar11;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])();
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(dVar5 + dVar3,dVar4 + dVar6);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(dVar9,dVar10);
  return;
}

Assistant:

void Fl_Graphics_Driver::curve(double X0, double Y0,
	      double X1, double Y1,
	      double X2, double Y2,
	      double X3, double Y3) {

  double x = fl_transform_x(X0,Y0);
  double y = fl_transform_y(X0,Y0);

  // draw point 0:
  fl_transformed_vertex(x,y);

  double x1 = fl_transform_x(X1,Y1);
  double yy1 = fl_transform_y(X1,Y1);
  double x2 = fl_transform_x(X2,Y2);
  double y2 = fl_transform_y(X2,Y2);
  double x3 = fl_transform_x(X3,Y3);
  double y3 = fl_transform_y(X3,Y3);

  // find the area:
  double a = fabs((x-x2)*(y3-yy1)-(y-y2)*(x3-x1));
  double b = fabs((x-x3)*(y2-yy1)-(y-y3)*(x2-x1));
  if (b > a) a = b;

  // use that to guess at the number of segments:
  int n = int(sqrt(a)/4);
  if (n > 1) {
    if (n > 100) n = 100; // make huge curves not hang forever

    double e = 1.0/n;

    // calculate the coefficients of 3rd order equation:
    double xa = (x3-3*x2+3*x1-x);
    double xb = 3*(x2-2*x1+x);
    double xc = 3*(x1-x);
    // calculate the forward differences:
    double dx1 = ((xa*e+xb)*e+xc)*e;
    double dx3 = 6*xa*e*e*e;
    double dx2 = dx3 + 2*xb*e*e;

    // calculate the coefficients of 3rd order equation:
    double ya = (y3-3*y2+3*yy1-y);
    double yb = 3*(y2-2*yy1+y);
    double yc = 3*(yy1-y);
    // calculate the forward differences:
    double dy1 = ((ya*e+yb)*e+yc)*e;
    double dy3 = 6*ya*e*e*e;
    double dy2 = dy3 + 2*yb*e*e;

    // draw points 1 .. n-2:
    for (int m=2; m<n; m++) {
      x += dx1;
      dx1 += dx2;
      dx2 += dx3;
      y += dy1;
      dy1 += dy2;
      dy2 += dy3;
      fl_transformed_vertex(x,y);
    }

    // draw point n-1:
    fl_transformed_vertex(x+dx1, y+dy1);
  }

  // draw point n:
  fl_transformed_vertex(x3,y3);
}